

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seed_rng.hpp
# Opt level: O2

void __thiscall boost::uuids::detail::seed_rng::seed_rng(seed_rng *this)

{
  FILE *pFVar1;
  
  this->rd_index_ = 5;
  this->random_ = (FILE *)0x0;
  pFVar1 = fopen("/dev/urandom","rb");
  this->random_ = (FILE *)pFVar1;
  this->rd_[0] = 0;
  this->rd_[1] = 0;
  this->rd_[2] = 0;
  this->rd_[3] = 0;
  this->rd_[4] = 0;
  return;
}

Assistant:

seed_rng() BOOST_NOEXCEPT
        : rd_index_(5)
        , random_(0)
    {
#if defined(BOOST_WINDOWS)
        if (!boost::winapi::CryptAcquireContextW(
                    &random_,
                    NULL,
                    NULL,
                    boost::winapi::PROV_RSA_FULL_,
                    boost::winapi::CRYPT_VERIFYCONTEXT_ | boost::winapi::CRYPT_SILENT_))
        {
            random_ = 0;
        }
#else
        random_ = std::fopen( "/dev/urandom", "rb" );
#endif

        std::memset(rd_, 0, sizeof(rd_));
    }